

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O3

void __thiscall
SuiteSessionTests::logonAtLogonStartTimeFixture::~logonAtLogonStartTimeFixture
          (logonAtLogonStartTimeFixture *this)

{
  MemoryStoreFactory *this_00;
  
  this_00 = &this[-1].super_acceptorFixture.super_sessionFixture.factory;
  sessionFixture::~sessionFixture((sessionFixture *)this_00);
  operator_delete(this_00,0x628);
  return;
}

Assistant:

logonAtLogonStartTimeFixture()
  {
    startTime.setCurrent();
    startTime.setMillisecond(0);

    endTime.setCurrent();
    endTime.setMillisecond(0);

    startTime += -10;
    endTime += 10;

    UtcTimeOnly logonStartTime;
    UtcTimeOnly logonEndTime;
    logonStartTime += 1;
    logonEndTime += 2;
    TimeRange logonTime( logonStartTime, logonEndTime );

    object->setLogonTime( logonTime );
  }